

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

counting_iterator
fmt::v6::internal::write_exponent<wchar_t,fmt::v6::internal::counting_iterator>
          (int exp,counting_iterator it)

{
  size_t in_RSI;
  int in_EDI;
  char *d;
  char *top;
  counting_iterator *in_stack_ffffffffffffff48;
  counting_iterator local_b0;
  value_type local_a1;
  wchar_t local_a0 [2];
  counting_iterator local_98;
  value_type local_8d;
  wchar_t local_8c;
  char *local_88;
  counting_iterator local_78;
  value_type local_69;
  wchar_t local_68 [2];
  counting_iterator local_60;
  value_type local_55;
  wchar_t local_54;
  char *local_50;
  counting_iterator local_40;
  value_type local_31;
  wchar_t local_30 [2];
  counting_iterator local_28;
  value_type local_19;
  wchar_t local_18;
  int local_14;
  size_t local_10;
  
  local_14 = in_EDI;
  local_10 = in_RSI;
  if (in_EDI < 0) {
    local_18 = L'-';
    local_28 = counting_iterator::operator++(in_stack_ffffffffffffff48,0);
    counting_iterator::operator*(&local_28);
    counting_iterator::value_type::operator=(&local_19,&local_18);
    local_14 = -local_14;
  }
  else {
    local_30[0] = L'+';
    local_40 = counting_iterator::operator++(in_stack_ffffffffffffff48,0);
    counting_iterator::operator*(&local_40);
    counting_iterator::value_type::operator=(&local_31,local_30);
  }
  if (99 < local_14) {
    local_50 = basic_data<void>::digits + (local_14 / 100 << 1);
    if (999 < local_14) {
      local_54 = (wchar_t)*local_50;
      local_60 = counting_iterator::operator++(in_stack_ffffffffffffff48,0);
      counting_iterator::operator*(&local_60);
      counting_iterator::value_type::operator=(&local_55,&local_54);
    }
    local_68[0] = (wchar_t)local_50[1];
    local_78 = counting_iterator::operator++(in_stack_ffffffffffffff48,0);
    counting_iterator::operator*(&local_78);
    counting_iterator::value_type::operator=(&local_69,local_68);
    local_14 = local_14 % 100;
  }
  local_88 = basic_data<void>::digits + (local_14 << 1);
  local_8c = (wchar_t)*local_88;
  local_98 = counting_iterator::operator++(in_stack_ffffffffffffff48,0);
  counting_iterator::operator*(&local_98);
  counting_iterator::value_type::operator=(&local_8d,&local_8c);
  local_a0[0] = (wchar_t)local_88[1];
  local_b0 = counting_iterator::operator++(in_stack_ffffffffffffff48,0);
  counting_iterator::operator*(&local_b0);
  counting_iterator::value_type::operator=(&local_a1,local_a0);
  return (counting_iterator)local_10;
}

Assistant:

It write_exponent(int exp, It it) {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits + (exp / 100) * 2;
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits + exp * 2;
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}